

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

string * __thiscall pbrt::FilmBase::BaseToString_abi_cxx11_(FilmBase *this)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  FilterHandle *in_stack_00000010;
  Point2<int> *in_stack_00000020;
  char *in_stack_00000028;
  Bounds2<int> *in_stack_00000040;
  
  StringPrintf<pbrt::Point2<int>const&,float_const&,pbrt::FilterHandle_const&,std::__cxx11::string_const&,pbrt::Bounds2<int>const&>
            (in_stack_00000028,in_stack_00000020,(float *)this,in_stack_00000010,in_stack_00000008,
             in_stack_00000040);
  return in_RDI;
}

Assistant:

std::string FilmBase::BaseToString() const {
    return StringPrintf("fullResolution: %s diagonal: %f filter: %s filename: %s "
                        "pixelBounds: %s",
                        fullResolution, diagonal, filter, filename, pixelBounds);
}